

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<std::pair<QTableWidgetItem*,int>>::emplace<QTableWidgetItem*&,int&>
          (QPodArrayOps<std::pair<QTableWidgetItem_*,_int>_> *this,qsizetype i,
          QTableWidgetItem **args,int *args_1)

{
  bool bVar1;
  qsizetype qVar2;
  pair<QTableWidgetItem_*,_int> *ppVar3;
  int *in_RCX;
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *in_RDX;
  long in_RSI;
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *in_RDI;
  long in_FS_OFFSET;
  pair<QTableWidgetItem_*,_int> *where;
  GrowthPosition pos;
  bool detach;
  pair<QTableWidgetItem_*,_int> tmp;
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *in_stack_ffffffffffffffb8;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar5;
  GrowthPosition where_00;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::needsDetach(in_RDI);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc4);
  if (!bVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::freeSpaceAtEnd
                          (in_stack_ffffffffffffffb8), qVar2 != 0)) {
      ppVar3 = QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::end(in_RDI);
      std::pair<QTableWidgetItem_*,_int>::pair<QTableWidgetItem_*&,_int_&,_true>
                (ppVar3,(QTableWidgetItem **)in_RDX,in_RCX);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_008e5126;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::freeSpaceAtBegin
                          (in_stack_ffffffffffffffb8), qVar2 != 0)) {
      ppVar3 = QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::begin
                         ((QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)0x8e504e);
      std::pair<QTableWidgetItem_*,_int>::pair<QTableWidgetItem_*&,_int_&,_true>
                (ppVar3 + -1,(QTableWidgetItem **)in_RDX,in_RCX);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_008e5126;
    }
  }
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::pair<QTableWidgetItem_*,_int>::pair<QTableWidgetItem_*&,_int_&,_true>
            ((pair<QTableWidgetItem_*,_int> *)local_18,(QTableWidgetItem **)in_RDX,in_RCX);
  where_00 = (GrowthPosition)((ulong)in_RCX >> 0x20);
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::detachAndGrow
            (in_RDX,where_00,CONCAT44(uVar5,uVar4),
             (pair<QTableWidgetItem_*,_int> **)in_stack_ffffffffffffffb8,in_RDI);
  ppVar3 = QPodArrayOps<std::pair<QTableWidgetItem_*,_int>_>::createHole
                     ((QPodArrayOps<std::pair<QTableWidgetItem_*,_int>_> *)in_RDX,where_00,
                      CONCAT44(uVar5,uVar4),(qsizetype)in_stack_ffffffffffffffb8);
  ppVar3->first = (QTableWidgetItem *)local_18._0_8_;
  *(undefined8 *)&ppVar3->second = local_18._8_8_;
LAB_008e5126:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }